

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

size_t __thiscall booster::aio::stream_socket::bytes_readable(stream_socket *this,error_code *e)

{
  uint in_EAX;
  native_type __fd;
  int iVar1;
  size_t sVar2;
  error_code eVar3;
  int size;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  __fd = basic_io_device::native((basic_io_device *)this);
  iVar1 = ioctl(__fd,0x541b,(long)&uStack_18 + 4);
  if (iVar1 < 0) {
    eVar3 = socket_details::geterror();
    e->_M_value = eVar3._M_value;
    e->_M_cat = eVar3._M_cat;
    sVar2 = 0;
  }
  else {
    sVar2 = (size_t)uStack_18._4_4_;
  }
  return sVar2;
}

Assistant:

size_t stream_socket::bytes_readable(booster::system::error_code &e)
{
	#ifdef BOOSTER_WIN32
	unsigned long size = 0;
	int r = ::ioctlsocket(native(),FIONREAD,&size);
	if(r != 0) {
		e=geterror();
		return 0;
	}
	return size;
	#else
	int size = 0;
	int r = ::ioctl(native(),FIONREAD,&size);
	if(r < 0) {
		e=geterror();
		return 0;
	}
	return size;
	#endif
}